

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O1

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenRegex(cmSourceGroup *this,string *name)

{
  cmSourceGroup *pcVar1;
  cmSourceGroup *pcVar2;
  cmSourceGroup *this_00;
  cmSourceGroup *unaff_R15;
  bool bVar3;
  
  this_00 = (this->Internal->GroupChildren).
            super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar1 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = this_00 == pcVar1;
  if (!bVar3) {
    pcVar2 = MatchChildrenRegex(this_00,name);
    unaff_R15 = pcVar2;
    while (unaff_R15 == (cmSourceGroup *)0x0) {
      this_00 = this_00 + 1;
      bVar3 = this_00 == pcVar1;
      unaff_R15 = pcVar2;
      if (bVar3) break;
      unaff_R15 = MatchChildrenRegex(this_00,name);
    }
  }
  if (bVar3) {
    bVar3 = cmsys::RegularExpression::find
                      (&this->GroupRegex,(name->_M_dataplus)._M_p,&(this->GroupRegex).regmatch);
    unaff_R15 = (cmSourceGroup *)0x0;
    if (bVar3) {
      unaff_R15 = this;
    }
  }
  return unaff_R15;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenRegex(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    cmSourceGroup* result = group.MatchChildrenRegex(name);
    if (result) {
      return result;
    }
  }
  if (this->MatchesRegex(name)) {
    return this;
  }

  return nullptr;
}